

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  ParameterPortListSyntax *pPVar1;
  Token *unaff_retaddr;
  Token *in_stack_00000008;
  BumpAllocator *in_stack_00000010;
  BumpAllocator *in_stack_000000f8;
  SeparatedSyntaxList<slang::syntax::ParameterDeclarationBaseSyntax> *in_stack_00000100;
  
  parsing::Token::deepClone((Token *)in_stack_00000100,in_stack_000000f8);
  parsing::Token::deepClone((Token *)in_stack_00000100,in_stack_000000f8);
  deepClone<slang::syntax::ParameterDeclarationBaseSyntax>(in_stack_00000100,in_stack_000000f8);
  parsing::Token::deepClone((Token *)in_stack_00000100,in_stack_000000f8);
  pPVar1 = BumpAllocator::
           emplace<slang::syntax::ParameterPortListSyntax,slang::parsing::Token,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::ParameterDeclarationBaseSyntax>&,slang::parsing::Token>
                     (in_stack_00000010,in_stack_00000008,unaff_retaddr,
                      (SeparatedSyntaxList<slang::syntax::ParameterDeclarationBaseSyntax> *)__fn,
                      (Token *)__child_stack);
  return (int)pPVar1;
}

Assistant:

static SyntaxNode* clone(const ParameterPortListSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ParameterPortListSyntax>(
        node.hash.deepClone(alloc),
        node.openParen.deepClone(alloc),
        *deepClone(node.declarations, alloc),
        node.closeParen.deepClone(alloc)
    );
}